

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder.h
# Opt level: O1

NodeRef __thiscall
embree::avx::BVHNBuilderVirtual<8>::
BVHNBuilderT<embree::avx::CreateLeaf<8,_embree::TriangleMv<4>_>_>::createLeaf
          (BVHNBuilderT<embree::avx::CreateLeaf<8,_embree::TriangleMv<4>_>_> *this,PrimRef *prims,
          range<unsigned_long> *set,Allocator *alloc)

{
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  uint uVar7;
  undefined4 uVar8;
  FastAllocator *this_00;
  ThreadLocal *pTVar9;
  ThreadLocal2 *pTVar10;
  iterator __position;
  Ref<embree::Geometry> *pRVar11;
  Geometry *pGVar12;
  long lVar13;
  RTCFilterFunctionN p_Var14;
  ulong uVar15;
  ulong uVar16;
  char *pcVar17;
  undefined1 (*pauVar18) [16];
  size_t sVar19;
  long lVar20;
  unsigned_long uVar21;
  ulong uVar22;
  long lVar23;
  uint *puVar24;
  long lVar25;
  undefined1 auVar26 [16];
  undefined1 in_ZMM0 [64];
  vuint<4> vgeomID;
  vuint<4> vprimID;
  undefined1 local_108 [16];
  ulong local_f8;
  PrimRef *local_f0;
  ThreadLocal2 *local_e8;
  char cStack_e0;
  undefined7 uStack_df;
  undefined1 auStack_d8 [16];
  undefined1 auStack_c8 [16];
  ThreadLocal2 *local_b8;
  char cStack_b0;
  undefined7 uStack_af;
  undefined1 auStack_a8 [16];
  undefined1 auStack_98 [16];
  long local_88;
  BVHNBuilderT<embree::avx::CreateLeaf<8,_embree::TriangleMv<4>_>_> *local_80;
  ThreadLocal2 *local_78;
  undefined8 uStack_70;
  undefined1 auStack_68 [16];
  undefined1 auStack_58 [16];
  undefined1 local_48 [16];
  
  auVar26 = in_ZMM0._0_16_;
  uVar21 = set->_begin;
  uVar15 = (set->_end - uVar21) + 3;
  local_f8 = uVar15 >> 2;
  this_00 = alloc->alloc;
  pTVar9 = alloc->talloc1;
  local_108._8_8_ = local_108._0_8_;
  local_108._0_8_ = local_f8 * 0xb0;
  pTVar10 = pTVar9->parent;
  local_f0 = prims;
  if (this_00 != (pTVar10->alloc)._M_b._M_p) {
    cStack_b0 = '\x01';
    local_b8 = pTVar10;
    MutexSys::lock(&pTVar10->mutex);
    if ((pTVar10->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((pTVar10->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (pTVar10->alloc1).bytesUsed + (pTVar10->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((pTVar10->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((pTVar10->alloc0).end + (pTVar10->alloc1).end) -
           ((pTVar10->alloc0).cur + (pTVar10->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((pTVar10->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (pTVar10->alloc1).bytesWasted + (pTVar10->alloc0).bytesWasted;
      UNLOCK();
    }
    (pTVar10->alloc0).end = 0;
    (pTVar10->alloc0).allocBlockSize = 0;
    (pTVar10->alloc0).bytesUsed = 0;
    (pTVar10->alloc0).bytesWasted = 0;
    (pTVar10->alloc0).ptr = (char *)0x0;
    (pTVar10->alloc0).cur = 0;
    (pTVar10->alloc0).end = 0;
    (pTVar10->alloc0).allocBlockSize = 0;
    if (this_00 == (FastAllocator *)0x0) {
      (pTVar10->alloc1).end = 0;
      (pTVar10->alloc1).allocBlockSize = 0;
      (pTVar10->alloc1).bytesUsed = 0;
      (pTVar10->alloc1).bytesWasted = 0;
      (pTVar10->alloc1).ptr = (char *)0x0;
      (pTVar10->alloc1).cur = 0;
      (pTVar10->alloc1).end = 0;
      (pTVar10->alloc1).allocBlockSize = 0;
    }
    else {
      (pTVar10->alloc0).allocBlockSize = this_00->defaultBlockSize;
      (pTVar10->alloc1).ptr = (char *)0x0;
      (pTVar10->alloc1).cur = 0;
      (pTVar10->alloc1).end = 0;
      (pTVar10->alloc1).allocBlockSize = 0;
      (pTVar10->alloc1).end = 0;
      (pTVar10->alloc1).allocBlockSize = 0;
      (pTVar10->alloc1).bytesUsed = 0;
      (pTVar10->alloc1).bytesWasted = 0;
      (pTVar10->alloc1).allocBlockSize = this_00->defaultBlockSize;
    }
    LOCK();
    (pTVar10->alloc)._M_b._M_p = this_00;
    UNLOCK();
    local_e8 = (ThreadLocal2 *)&FastAllocator::s_thread_local_allocators_lock;
    cStack_e0 = '\x01';
    auVar26 = (undefined1  [16])0x0;
    local_78 = pTVar10;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    __position._M_current =
         (this_00->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this_00->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&this_00->thread_local_allocators,__position,&local_78);
    }
    else {
      *__position._M_current = local_78;
      pppTVar2 = &(this_00->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar2 = *pppTVar2 + 1;
    }
    if (cStack_e0 == '\x01') {
      MutexSys::unlock(&local_e8->mutex);
    }
    if (cStack_b0 == '\x01') {
      MutexSys::unlock(&local_b8->mutex);
    }
  }
  pTVar9->bytesUsed = pTVar9->bytesUsed + local_108._0_8_;
  sVar19 = pTVar9->cur;
  uVar22 = (ulong)(-(int)sVar19 & 0xf);
  uVar16 = sVar19 + local_108._0_8_ + uVar22;
  pTVar9->cur = uVar16;
  if (pTVar9->end < uVar16) {
    pTVar9->cur = sVar19;
    if ((ThreadLocal2 *)pTVar9->allocBlockSize < (ThreadLocal2 *)(local_108._0_8_ << 2)) {
      pcVar17 = (char *)FastAllocator::malloc(this_00,(size_t)local_108);
    }
    else {
      local_e8 = (ThreadLocal2 *)pTVar9->allocBlockSize;
      pcVar17 = (char *)FastAllocator::malloc(this_00,(size_t)&local_e8);
      pTVar9->ptr = pcVar17;
      sVar19 = (pTVar9->end - pTVar9->cur) + pTVar9->bytesWasted;
      pTVar9->bytesWasted = sVar19;
      pTVar9->cur = 0;
      pTVar9->end = (size_t)local_e8;
      pTVar9->cur = local_108._0_8_;
      if (local_e8 < (ulong)local_108._0_8_) {
        pTVar9->cur = 0;
        local_e8 = (ThreadLocal2 *)pTVar9->allocBlockSize;
        pcVar17 = (char *)FastAllocator::malloc(this_00,(size_t)&local_e8);
        pTVar9->ptr = pcVar17;
        sVar19 = (pTVar9->end - pTVar9->cur) + pTVar9->bytesWasted;
        pTVar9->bytesWasted = sVar19;
        pTVar9->cur = 0;
        pTVar9->end = (size_t)local_e8;
        pTVar9->cur = local_108._0_8_;
        if (local_e8 < (ulong)local_108._0_8_) {
          pTVar9->cur = 0;
          pcVar17 = (char *)0x0;
        }
        else {
          pTVar9->bytesWasted = sVar19;
        }
      }
      else {
        pTVar9->bytesWasted = sVar19;
      }
    }
  }
  else {
    pTVar9->bytesWasted = pTVar9->bytesWasted + uVar22;
    pcVar17 = pTVar9->ptr + (uVar16 - local_108._0_8_);
  }
  if (3 < uVar15) {
    lVar23 = local_f8 + (local_f8 == 0);
    local_f0 = (PrimRef *)((long)&(local_f0->upper).field_0 + 0xc);
    lVar20 = 0;
    auVar26 = vpcmpeqd_avx(auVar26,auVar26);
    local_e8 = (ThreadLocal2 *)0x0;
    pTVar10 = local_e8;
    local_88 = lVar23;
    local_80 = this;
    do {
      uVar15 = set->_end;
      auStack_c8 = (undefined1  [16])0x0;
      cStack_e0 = 0;
      uStack_df = 0;
      auStack_d8 = (undefined1  [16])0x0;
      auStack_98 = (undefined1  [16])0x0;
      auStack_a8 = (undefined1  [16])0x0;
      auStack_58 = (undefined1  [16])0x0;
      uStack_70 = 0;
      auStack_68 = (undefined1  [16])0x0;
      local_108 = auVar26;
      local_e8 = pTVar10;
      local_b8 = pTVar10;
      cStack_b0 = cStack_e0;
      uStack_af = uStack_df;
      local_78 = pTVar10;
      local_48 = auVar26;
      if (uVar21 < uVar15) {
        pRVar11 = (((this->createLeafFunc).bvh)->scene->geometries).items;
        puVar24 = (uint *)((long)local_f0 + uVar21 * 0x20);
        uVar16 = 0;
        do {
          uVar6 = puVar24[-4];
          uVar7 = *puVar24;
          pGVar12 = pRVar11[uVar6].ptr;
          lVar25 = (ulong)uVar7 *
                   pGVar12[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
          lVar23 = *(long *)&pGVar12->field_0x58;
          lVar13 = *(long *)&pGVar12[1].time_range.upper;
          p_Var14 = pGVar12[1].intersectionFilterN;
          auVar3 = *(undefined1 (*) [16])
                    (lVar13 + (ulong)*(uint *)(lVar23 + lVar25) * (long)p_Var14);
          auVar4 = *(undefined1 (*) [16])
                    (lVar13 + (ulong)*(uint *)(lVar23 + 4 + lVar25) * (long)p_Var14);
          auVar5 = *(undefined1 (*) [16])
                    (lVar13 + (ulong)*(uint *)(lVar23 + 8 + lVar25) * (long)p_Var14);
          *(int *)((long)&local_e8 + uVar16 * 4) = auVar3._0_4_;
          uVar8 = vextractps_avx(auVar3,1);
          *(undefined4 *)(auStack_d8 + uVar16 * 4) = uVar8;
          uVar8 = vextractps_avx(auVar3,2);
          *(undefined4 *)(auStack_c8 + uVar16 * 4) = uVar8;
          *(int *)((long)&local_b8 + uVar16 * 4) = auVar4._0_4_;
          uVar8 = vextractps_avx(auVar4,1);
          *(undefined4 *)(auStack_a8 + uVar16 * 4) = uVar8;
          uVar8 = vextractps_avx(auVar4,2);
          *(undefined4 *)(auStack_98 + uVar16 * 4) = uVar8;
          *(int *)((long)&local_78 + uVar16 * 4) = auVar5._0_4_;
          uVar8 = vextractps_avx(auVar5,1);
          *(undefined4 *)(auStack_68 + uVar16 * 4) = uVar8;
          uVar8 = vextractps_avx(auVar5,2);
          *(undefined4 *)(auStack_58 + uVar16 * 4) = uVar8;
          *(uint *)(local_108 + uVar16 * 4) = uVar6;
          *(uint *)(local_48 + uVar16 * 4) = uVar7;
          uVar22 = uVar16 + 1;
          if (2 < uVar16) break;
          lVar23 = uVar16 + uVar21;
          puVar24 = puVar24 + 8;
          uVar16 = uVar22;
        } while (lVar23 + 1U < uVar15);
        uVar21 = uVar21 + uVar22;
        lVar23 = local_88;
        this = local_80;
      }
      pauVar18 = (undefined1 (*) [16])(pcVar17 + lVar20 * 0xb0);
      auVar3[8] = cStack_e0;
      auVar3._0_8_ = local_e8;
      auVar3._9_7_ = uStack_df;
      auVar4[8] = cStack_b0;
      auVar4._0_8_ = local_b8;
      auVar4._9_7_ = uStack_af;
      auVar5._8_8_ = uStack_70;
      auVar5._0_8_ = local_78;
      auVar3 = vmovntps_avx(auVar3);
      *pauVar18 = auVar3;
      auVar3 = vmovntps_avx(auStack_d8);
      pauVar18[1] = auVar3;
      auVar3 = vmovntps_avx(auStack_c8);
      pauVar18[2] = auVar3;
      auVar3 = vmovntps_avx(auVar4);
      pauVar18[3] = auVar3;
      auVar3 = vmovntps_avx(auStack_a8);
      pauVar18[4] = auVar3;
      auVar3 = vmovntps_avx(auStack_98);
      pauVar18[5] = auVar3;
      auVar3 = vmovntps_avx(auVar5);
      pauVar18[6] = auVar3;
      auVar3 = vmovntps_avx(auStack_68);
      pauVar18[7] = auVar3;
      auVar3 = vmovntps_avx(auStack_58);
      pauVar18[8] = auVar3;
      auVar3 = vmovntps_avx(local_108);
      pauVar18[9] = auVar3;
      auVar3 = vmovntps_avx(local_48);
      pauVar18[10] = auVar3;
      lVar20 = lVar20 + 1;
    } while (lVar20 != lVar23);
  }
  uVar15 = 7;
  if (local_f8 < 7) {
    uVar15 = local_f8;
  }
  return (NodeRef)(uVar15 | (ulong)pcVar17 | 8);
}

Assistant:

NodeRef createLeaf (const PrimRef* prims, const range<size_t>& set, const Allocator& alloc) {
            return createLeafFunc(prims,set,alloc);
          }